

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::
Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
::MergePartialFromCodedStream
          (Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
           *this,CodedInputStream *input)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  uint8 *puVar1;
  size_type sVar2;
  bool bVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  byte local_29;
  double local_28;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (*puVar1 == '\n')) {
    input->buffer_ = puVar1 + 1;
    value = &this->key_;
    bVar3 = WireFormatLite::ReadBytes(input,value);
    if (!bVar3) {
LAB_001c2738:
      local_29 = 0;
      goto LAB_001c273a;
    }
    if ((0 < *(int *)&input->buffer_end_ - (int)input->buffer_) && (*input->buffer_ == '\x11')) {
      sVar2 = this->map_->elements_->num_elements_;
      pdVar4 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               ::operator[](this->map_,value);
      this->value_ptr_ = pdVar4;
      if (sVar2 != this->map_->elements_->num_elements_) {
        io::CodedInputStream::Skip(input,1);
        pdVar4 = this->value_ptr_;
        pdVar5 = (double *)input->buffer_;
        pdVar6 = (double *)input->buffer_end_;
        if ((int)pdVar6 - (int)pdVar5 < 8) {
          bVar3 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_28);
          if (!bVar3) {
            Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
            ::erase(this->map_,value);
            goto LAB_001c2738;
          }
          pdVar5 = (double *)input->buffer_;
          pdVar6 = (double *)input->buffer_end_;
        }
        else {
          local_28 = *pdVar5;
          pdVar5 = pdVar5 + 1;
          input->buffer_ = (uint8 *)pdVar5;
        }
        *pdVar4 = local_28;
        if ((pdVar5 == pdVar6) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          local_29 = 1;
        }
        else {
          local_29 = ReadBeyondKeyValuePair(this,input);
        }
        goto LAB_001c273a;
      }
    }
  }
  else {
    MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::MessageLite,std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>
    ::
    Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::Map<std::__cxx11::string,double>>
    ::MergePartialFromCodedStream(this);
  }
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::MessageLite,std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>
  ::
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::Map<std::__cxx11::string,double>>
  ::MergePartialFromCodedStream();
LAB_001c273a:
  return (bool)(local_29 & 1);
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
      // Look for the expected thing: a key and then a value.  If it fails,
      // invoke the enclosing class's MergePartialFromCodedStream, or return
      // false if that would be pointless.
      if (input->ExpectTag(kKeyTag)) {
        if (!KeyTypeHandler::Read(input, &key_)) {
          return false;
        }
        // Peek at the next byte to see if it is kValueTag.  If not, bail out.
        const void* data;
        int size;
        input->GetDirectBufferPointerInline(&data, &size);
        // We could use memcmp here, but we don't bother. The tag is one byte.
        GOOGLE_COMPILE_ASSERT(kTagSize == 1, tag_size_error);
        if (size > 0 && *reinterpret_cast<const char*>(data) == kValueTag) {
          typename Map::size_type size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (GOOGLE_PREDICT_TRUE(size != map_->size())) {
            // We created a new key-value pair.  Fill in the value.
            typedef
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type T;
            input->Skip(kTagSize);  // Skip kValueTag.
            if (!ValueTypeHandler::Read(input,
                                        reinterpret_cast<T>(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return false;
            }
            if (input->ExpectAtEnd()) return true;
            return ReadBeyondKeyValuePair(input);
          }
        }
      } else {
        key_ = Key();
      }

      entry_.reset(mf_->NewEntry());
      *entry_->mutable_key() = key_;
      const bool result = entry_->MergePartialFromCodedStream(input);
      if (result) UseKeyAndValueFromEntry();
      if (entry_->GetArena() != NULL) entry_.release();
      return result;
    }